

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void g_radio_setup(void)

{
  _class *p_Var1;
  t_symbol *ptVar2;
  
  ptVar2 = gensym("hradio");
  radio_class = class_new(ptVar2,radio_new,radio_free,0x4b0,0,A_GIMME,0);
  ptVar2 = gensym("vradio");
  class_addcreator(radio_new,ptVar2,A_GIMME,0);
  ptVar2 = gensym("rdb");
  class_addcreator(radio_new,ptVar2,A_GIMME,0);
  ptVar2 = gensym("radiobut");
  class_addcreator(radio_new,ptVar2,A_GIMME,0);
  ptVar2 = gensym("radiobutton");
  class_addcreator(radio_new,ptVar2,A_GIMME,0);
  class_addbang(radio_class,radio_bang);
  class_doaddfloat(radio_class,radio_float);
  p_Var1 = radio_class;
  ptVar2 = gensym("click");
  class_addmethod(p_Var1,radio_click,ptVar2,A_FLOAT,1,1,1,1,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("dialog");
  class_addmethod(p_Var1,radio_dialog,ptVar2,A_GIMME,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("loadbang");
  class_addmethod(p_Var1,radio_loadbang,ptVar2,A_DEFFLOAT,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("set");
  class_addmethod(p_Var1,radio_set,ptVar2,A_FLOAT,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("size");
  class_addmethod(p_Var1,radio_size,ptVar2,A_GIMME,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("delta");
  class_addmethod(p_Var1,radio_delta,ptVar2,A_GIMME,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("pos");
  class_addmethod(p_Var1,radio_pos,ptVar2,A_GIMME,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("color");
  class_addmethod(p_Var1,radio_color,ptVar2,A_GIMME,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("send");
  class_addmethod(p_Var1,radio_send,ptVar2,A_DEFSYM,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("receive");
  class_addmethod(p_Var1,radio_receive,ptVar2,A_DEFSYM,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("label");
  class_addmethod(p_Var1,radio_label,ptVar2,A_DEFSYM,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("label_pos");
  class_addmethod(p_Var1,radio_label_pos,ptVar2,A_GIMME,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("label_font");
  class_addmethod(p_Var1,radio_label_font,ptVar2,A_GIMME,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("init");
  class_addmethod(p_Var1,radio_init,ptVar2,A_FLOAT,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("number");
  class_addmethod(p_Var1,radio_number,ptVar2,A_FLOAT,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("orientation");
  class_addmethod(p_Var1,radio_orientation,ptVar2,A_FLOAT,0);
  p_Var1 = radio_class;
  ptVar2 = gensym("zoom");
  class_addmethod(p_Var1,iemgui_zoom,ptVar2,A_CANT,0);
  radio_widgetbehavior.w_getrectfn = radio_getrect;
  radio_widgetbehavior.w_displacefn = iemgui_displace;
  radio_widgetbehavior.w_selectfn = iemgui_select;
  radio_widgetbehavior.w_activatefn = (t_activatefn)0x0;
  radio_widgetbehavior.w_deletefn = iemgui_delete;
  radio_widgetbehavior.w_visfn = iemgui_vis;
  radio_widgetbehavior.w_clickfn = radio_newclick;
  class_setwidget(radio_class,&radio_widgetbehavior);
  p_Var1 = radio_class;
  ptVar2 = gensym("radio");
  class_sethelpsymbol(p_Var1,ptVar2);
  class_setsavefn(radio_class,radio_save);
  class_setpropertiesfn(radio_class,radio_properties);
  ptVar2 = gensym("hdl");
  class_addcreator(dial_new,ptVar2,A_GIMME);
  ptVar2 = gensym("vdl");
  class_addcreator(dial_new,ptVar2,A_GIMME);
  p_Var1 = radio_class;
  ptVar2 = gensym("single_change");
  class_addmethod(p_Var1,radio_single_change,ptVar2,A_NULL);
  p_Var1 = radio_class;
  ptVar2 = gensym("double_change");
  class_addmethod(p_Var1,radio_double_change,ptVar2,A_NULL);
  return;
}

Assistant:

void g_radio_setup(void)
{
    radio_class = class_new(gensym("hradio"), (t_newmethod)radio_new,
        (t_method)radio_free, sizeof(t_radio), 0, A_GIMME, 0);
    class_addcreator((t_newmethod)radio_new, gensym("vradio"), A_GIMME, 0);

    class_addcreator((t_newmethod)radio_new, gensym("rdb"), A_GIMME, 0);
    class_addcreator((t_newmethod)radio_new, gensym("radiobut"), A_GIMME, 0);
    class_addcreator((t_newmethod)radio_new, gensym("radiobutton"), A_GIMME, 0);

    class_addbang(radio_class, radio_bang);
    class_addfloat(radio_class, radio_float);
    class_addmethod(radio_class, (t_method)radio_click,
        gensym("click"), A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, 0);
    class_addmethod(radio_class, (t_method)radio_dialog,
        gensym("dialog"), A_GIMME, 0);
    class_addmethod(radio_class, (t_method)radio_loadbang,
        gensym("loadbang"), A_DEFFLOAT, 0);
    class_addmethod(radio_class, (t_method)radio_set,
        gensym("set"), A_FLOAT, 0);
    class_addmethod(radio_class, (t_method)radio_size,
        gensym("size"), A_GIMME, 0);
    class_addmethod(radio_class, (t_method)radio_delta,
        gensym("delta"), A_GIMME, 0);
    class_addmethod(radio_class, (t_method)radio_pos,
        gensym("pos"), A_GIMME, 0);
    class_addmethod(radio_class, (t_method)radio_color,
        gensym("color"), A_GIMME, 0);
    class_addmethod(radio_class, (t_method)radio_send,
        gensym("send"), A_DEFSYM, 0);
    class_addmethod(radio_class, (t_method)radio_receive,
        gensym("receive"), A_DEFSYM, 0);
    class_addmethod(radio_class, (t_method)radio_label,
        gensym("label"), A_DEFSYM, 0);
    class_addmethod(radio_class, (t_method)radio_label_pos,
        gensym("label_pos"), A_GIMME, 0);
    class_addmethod(radio_class, (t_method)radio_label_font,
        gensym("label_font"), A_GIMME, 0);
    class_addmethod(radio_class, (t_method)radio_init,
        gensym("init"), A_FLOAT, 0);
    class_addmethod(radio_class, (t_method)radio_number,
        gensym("number"), A_FLOAT, 0);
    class_addmethod(radio_class, (t_method)radio_orientation,
        gensym("orientation"), A_FLOAT, 0);
    class_addmethod(radio_class, (t_method)iemgui_zoom,
        gensym("zoom"), A_CANT, 0);
    radio_widgetbehavior.w_getrectfn = radio_getrect;
    radio_widgetbehavior.w_displacefn = iemgui_displace;
    radio_widgetbehavior.w_selectfn = iemgui_select;
    radio_widgetbehavior.w_activatefn = NULL;
    radio_widgetbehavior.w_deletefn = iemgui_delete;
    radio_widgetbehavior.w_visfn = iemgui_vis;
    radio_widgetbehavior.w_clickfn = radio_newclick;
    class_setwidget(radio_class, &radio_widgetbehavior);

    class_sethelpsymbol(radio_class, gensym("radio"));
    class_setsavefn(radio_class, radio_save);
    class_setpropertiesfn(radio_class, radio_properties);

        /* obsolete version (0.34-0.35) */
    class_addcreator((t_newmethod)dial_new, gensym("hdl"), A_GIMME, 0);
    class_addcreator((t_newmethod)dial_new, gensym("vdl"), A_GIMME, 0);
    class_addmethod(radio_class, (t_method)radio_single_change,
        gensym("single_change"), 0);
    class_addmethod(radio_class, (t_method)radio_double_change,
        gensym("double_change"), 0);
}